

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkClearTriggerCache(sqlite3 *db,int iDb)

{
  HashElem *local_38;
  FKey *pFKey;
  Table *pTab;
  Hash *pHash;
  HashElem *k;
  int iDb_local;
  sqlite3 *db_local;
  
  for (pHash = (Hash *)((db->aDb[iDb].pSchema)->tblHash).first; pHash != (Hash *)0x0;
      pHash = *(Hash **)pHash) {
    if (*(char *)((long)&pHash->ht[3].chain + 7) == '\0') {
      for (local_38 = pHash->ht[4].chain; local_38 != (HashElem *)0x0; local_38 = local_38->prev) {
        fkTriggerDelete(db,(Trigger *)local_38[1].data);
        local_38[1].data = (void *)0x0;
        fkTriggerDelete(db,(Trigger *)local_38[1].pKey);
        local_38[1].pKey = (char *)0x0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkClearTriggerCache(sqlite3 *db, int iDb){
  HashElem *k;
  Hash *pHash = &db->aDb[iDb].pSchema->tblHash;
  for(k=sqliteHashFirst(pHash); k; k=sqliteHashNext(k)){
    Table *pTab = sqliteHashData(k);
    FKey *pFKey;
    if( !IsOrdinaryTable(pTab) ) continue;
    for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
      fkTriggerDelete(db, pFKey->apTrigger[0]); pFKey->apTrigger[0] = 0;
      fkTriggerDelete(db, pFKey->apTrigger[1]); pFKey->apTrigger[1] = 0;
    }
  }
}